

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

void pnga_select_elem(Integer g_a,char *op,void *val,Integer *subscript)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int contribute;
  long lVar5;
  bool bVar6;
  bool bVar7;
  Integer ndim;
  val_t *local_4f0;
  Integer *local_4e8;
  Integer local_4e0;
  elem_info_t info;
  Integer type;
  char *cptr;
  elem_info_t new_info;
  Integer hi [7];
  Integer lo [7];
  Integer ld [6];
  Integer dims [7];
  _iterator_hdl hdl_a;
  
  local_4e0 = 0;
  bVar7 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_4f0 = (val_t *)val;
  if (bVar7) {
    pnga_sync();
  }
  local_4e8 = subscript;
  pnga_nodeid();
  pnga_check_handle(g_a,"ga_select_elem");
  if ((*op != 'm') || (((op[1] != 'i' || (op[2] != 'n')) && ((op[1] != 'a' || (op[2] != 'x')))))) {
    pnga_error("operator not recognized",0);
  }
  pnga_inquire(g_a,&type,&ndim,dims);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&hdl_a);
  bVar7 = false;
  contribute = 0;
switchD_00128ee3_caseD_3ed:
  do {
    iVar1 = pnga_local_iterator_next(&hdl_a,lo,hi,&cptr,ld);
    if (iVar1 == 0) break;
    lVar3 = CONCAT44(ndim._4_4_,(int)ndim);
    lVar5 = (new_info.subscr[lVar3 + 9] - lo[lVar3 + -1]) + 1;
    for (lVar4 = 0; lVar4 < lVar3 + -1; lVar4 = lVar4 + 1) {
      lVar2 = (hi[lVar4] - lo[lVar4]) + 1;
      if (ld[lVar4] != lVar2) {
        pnga_error("layout problem",lVar4);
        lVar3 = CONCAT44(ndim._4_4_,(int)ndim);
        lVar2 = (hi[lVar4] - lo[lVar4]) + 1;
      }
      lVar5 = lVar5 * lVar2;
    }
    if (bVar7) {
      snga_select_elem(type,op,cptr,lVar5,&new_info,&local_4e0);
      bVar7 = true;
      contribute = 1;
      switch(type) {
      case 0x3e9:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          contribute = 1;
          if (info.v.ival <= new_info.v.ival) goto switchD_00128ee3_caseD_3ed;
        }
        else {
          contribute = 1;
          if (new_info.v.ival <= info.v.ival) goto switchD_00128ee3_caseD_3ed;
        }
        info.v.ival = new_info.v.ival;
        break;
      case 0x3ea:
      case 0x3f8:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          contribute = 1;
          if (info.v.lval <= CONCAT44(new_info.v.lval._4_4_,new_info.v.ival))
          goto switchD_00128ee3_caseD_3ed;
        }
        else {
          contribute = 1;
          if (CONCAT44(new_info.v.lval._4_4_,new_info.v.ival) <= info.v.lval)
          goto switchD_00128ee3_caseD_3ed;
        }
        info.v.lval._4_4_ = new_info.v.lval._4_4_;
        info.v.ival = new_info.v.ival;
        break;
      case 0x3eb:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          bVar6 = info.v.fval < new_info.v.fval;
        }
        else {
          bVar6 = new_info.v.fval < info.v.fval;
        }
        contribute = 1;
        if (bVar6 || info.v.fval == new_info.v.fval) goto switchD_00128ee3_caseD_3ed;
        info.v.ival = new_info.v.ival;
        break;
      case 0x3ec:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          bVar6 = info.v.dval < (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival);
        }
        else {
          bVar6 = (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival) < info.v.dval;
        }
        contribute = 1;
        if (bVar6 || info.v.dval == (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival))
        goto switchD_00128ee3_caseD_3ed;
        info.v.lval._4_4_ = new_info.v.lval._4_4_;
        info.v.ival = new_info.v.ival;
        break;
      default:
        goto switchD_00128ee3_caseD_3ed;
      case 0x3ee:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          bVar6 = info.v.fval < new_info.v.fval;
        }
        else {
          bVar6 = new_info.v.fval < info.v.fval;
        }
        contribute = 1;
        if (bVar6 || info.v.fval == new_info.v.fval) goto switchD_00128ee3_caseD_3ed;
        info.v.ival = new_info.v.ival;
        info.extra2 = new_info.extra2;
        break;
      case 0x3ef:
        if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
          bVar6 = info.v.dval < (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival);
        }
        else {
          bVar6 = (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival) < info.v.dval;
        }
        contribute = 1;
        if (bVar6 || info.v.dval == (double)CONCAT44(new_info.v.lval._4_4_,new_info.v.ival))
        goto switchD_00128ee3_caseD_3ed;
        info.v.lval._4_4_ = new_info.v.lval._4_4_;
        info.v.ival = new_info.v.ival;
        info.extra.real = new_info.extra.real;
        info.extra.imag = new_info.extra.imag;
      }
      lVar3 = CONCAT44(ndim._4_4_,(int)ndim);
      if (lVar3 < 1) {
        lVar3 = 0;
      }
      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
        lVar5 = (long)(((ulong)(uint)((int)hi[lVar4] - (int)lo[lVar4]) << 0x20) + 0x100000000) >>
                0x20;
        info.subscr[lVar4] = local_4e0 % lVar5 + lo[lVar4];
        local_4e0 = local_4e0 / lVar5;
      }
      contribute = 1;
      goto switchD_00128ee3_caseD_3ed;
    }
    snga_select_elem(type,op,cptr,lVar5,&info,&local_4e0);
    lVar3 = CONCAT44(ndim._4_4_,(int)ndim);
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      lVar5 = (long)(((ulong)(uint)((int)hi[lVar4] - (int)lo[lVar4]) << 0x20) + 0x100000000) >> 0x20
      ;
      info.subscr[lVar4] = local_4e0 % lVar5 + lo[lVar4];
      local_4e0 = local_4e0 / lVar5;
    }
    bVar7 = true;
    contribute = 1;
  } while( true );
  switch(type) {
  case 0x3e9:
    armci_msg_sel_scope(0x14d,&info,(int)ndim * 8 + 8,op,-99,contribute);
    local_4f0->ival = info.v.ival;
    break;
  case 0x3ea:
    iVar1 = -0x65;
    goto LAB_00129315;
  case 0x3eb:
    armci_msg_sel_scope(0x14d,&info,(int)ndim * 8 + 8,op,-0x132,contribute);
    local_4f0->ival = info.v.ival;
    break;
  case 0x3ec:
    armci_msg_sel_scope(0x14d,&info,(int)ndim * 8 + 8,op,-0x133,contribute);
    *local_4f0 = info.v;
    break;
  case 0x3ed:
switchD_0012920e_caseD_3ed:
    armci_msg_sel_scope(0x14d,&info,0x58,op,-0x133,contribute);
    local_4f0->dval = info.extra.real;
    local_4f0[1].dval = info.extra.imag;
    break;
  case 0x3ee:
    armci_msg_sel_scope(0x14d,&info,0x58,op,-0x132,contribute);
    info.v = (val_t)info.extra2;
    goto LAB_00129330;
  default:
    if (type != 0x3f8) goto switchD_0012920e_caseD_3ed;
    iVar1 = -0x66;
LAB_00129315:
    armci_msg_sel_scope(0x14d,&info,(int)ndim * 8 + 8,op,iVar1,contribute);
LAB_00129330:
    *local_4f0 = info.v;
  }
  lVar4 = 0;
  lVar3 = CONCAT44(ndim._4_4_,(int)ndim);
  if (CONCAT44(ndim._4_4_,(int)ndim) < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    local_4e8[lVar4] = info.subscr[lVar4];
  }
  return;
}

Assistant:

void pnga_select_elem(Integer g_a, char* op, void* val, Integer *subscript)
{
  Integer ndim, type, me, elems, ind=0, i;
  Integer lo[MAXDIM],hi[MAXDIM],dims[MAXDIM],ld[MAXDIM-1];
  elem_info_t info, new_info;
  Integer num_blocks;
  int     participate=0;
  int local_sync_begin;
  void *ptr;
  char *cptr;
  _iterator_hdl hdl_a;
  Integer first_pass;

  local_sync_begin = _ga_sync_begin; 
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  me = pnga_nodeid();

  pnga_check_handle(g_a, "ga_select_elem");

  if (strncmp(op,"min",3) == 0);
  else if (strncmp(op,"max",3) == 0);
  else pnga_error("operator not recognized",0);

  pnga_inquire(g_a, &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);


  first_pass = 1;
  pnga_local_iterator_init(g_a, &hdl_a);
  while (pnga_local_iterator_next(&hdl_a, lo, hi, &cptr, ld)) {
    Integer update;
    GET_ELEMS(ndim,lo,hi,ld,&elems);
    participate =1;
    ptr = (void*)cptr;

    if (first_pass) {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } else {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &new_info, &ind);

      /* compare with old block */
      snga_compare_elem(type,op, &new_info, &info, &update);
      /* determine element subscript in the ndim-array */
      if (update) {
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      }
    }
    first_pass = 0;
  }
#if 0
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, lo, hi);

    if ( lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      /******************* calculate local result ************************/
      void    *ptr;
      pnga_access_ptr(g_a, lo, hi, &ptr, ld);
      GET_ELEMS(ndim,lo,hi,ld,&elems);
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release(g_a, lo, hi);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } 
  } else {
    void *ptr;
    Integer j, offset, jtot, upper;
    Integer nproc = pnga_nnodes();
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    if (elems > 0) {
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release_block_segment(g_a, me);

      /* convert local index back into a global array index */
      if (!pnga_uses_proc_grid(g_a)) {
        offset = 0;
        for (i=me; i<num_blocks; i += nproc) {
          pnga_distribution(g_a, i, lo, hi);
          jtot = 1;
          for (j=0; j<ndim; j++) {
            jtot *= (hi[j]-lo[j]+1);
          }
          upper = offset + jtot;
          if (ind >= offset && ind < upper) {
            break;
          }  else {
            offset += jtot;
          }
        }
        /* determine element subscript in the ndim-array */
        ind -= offset;
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      } else {
        Integer stride[MAXDIM], index[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        Integer proc_index[MAXDIM], topology[MAXDIM];
        Integer l_index[MAXDIM];
        Integer min, max;
        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_grid(g_a, topology);
        if (!pnga_uses_irreg_proc_grid(g_a)) {
          pnga_get_block_info(g_a, blocks, block_dims);
          /* figure out strides for locally held block of data */
          for (i=0; i<ndim; i++) {
            stride[i] = 0;
            for (j=proc_index[i]; j<blocks[i]; j += topology[i]) {
              min = j*block_dims[i] + 1;
              max = (j+1)*block_dims[i];
              if (max > dims[i])
                max = dims[i];
              stride[i] += (max - min + 1);
            }
          }
          /* use strides to figure out local index */
          l_index[0] = ind%stride[0];
          for (i=1; i<ndim; i++) {
            ind = (ind-l_index[i-1])/stride[i-1];
            l_index[i] = ind%stride[i];
          }
          /* figure out block index for block holding data element */
          for (i=0; i<ndim; i++) {
            index[i] = l_index[i]/block_dims[i];
          }
          for (i=0; i<ndim; i++) {
            lo[i] = (topology[i]*index[i] + proc_index[i])*block_dims[i];
            info.subscr[i] = l_index[i]%block_dims[i] + lo[i];
          }
        } else {
        }
      }
    }
  }
#endif
  /* calculate global result */
  if(type==C_INT){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_INT,participate);
    *(int*)val = (int)info.v.ival;
  }else if(type==C_LONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG,participate);
    *(long*)val = info.v.lval;
  }else if(type==C_LONGLONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG_LONG,participate);
    *(long long*)val = info.v.llval;
  }else if(type==C_DBL){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoublePrecision*)val = info.v.dval;
  }else if(type==C_FLOAT){
    int size = sizeof(double) + sizeof(Integer)*ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(float*)val = info.v.fval;       
  }else if(type==C_SCPL){
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(SingleComplex*)val = info.extra2;
  }else{
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoubleComplex*)val = info.extra;
  }

  for(i = 0; i < ndim; i++) subscript[i]= info.subscr[i];
}